

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLFrameBuffer::addColorBuffer
          (GLFrameBuffer *this,shared_ptr<polyscope::render::RenderBuffer> *renderBufferIn)

{
  int *piVar1;
  runtime_error *this_00;
  shared_ptr<polyscope::render::backend_openGL_mock::GLRenderBuffer> renderBuffer;
  __shared_ptr<polyscope::render::RenderBuffer,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::
  dynamic_pointer_cast<polyscope::render::backend_openGL_mock::GLRenderBuffer,polyscope::render::RenderBuffer>
            ((shared_ptr<polyscope::render::RenderBuffer> *)&renderBuffer);
  if (renderBuffer.
      super___shared_ptr<polyscope::render::backend_openGL_mock::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])(this);
    std::__shared_ptr<polyscope::render::RenderBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<polyscope::render::backend_openGL_mock::GLRenderBuffer,void>
              (local_28,&renderBuffer.
                         super___shared_ptr<polyscope::render::backend_openGL_mock::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2>
              );
    std::
    vector<std::shared_ptr<polyscope::render::RenderBuffer>,std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>>>
    ::emplace_back<std::shared_ptr<polyscope::render::RenderBuffer>>
              ((vector<std::shared_ptr<polyscope::render::RenderBuffer>,std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>>>
                *)&(this->super_FrameBuffer).renderBuffersColor,
               (shared_ptr<polyscope::render::RenderBuffer> *)local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    piVar1 = &(this->super_FrameBuffer).nColorBuffers;
    *piVar1 = *piVar1 + 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&renderBuffer.
                super___shared_ptr<polyscope::render::backend_openGL_mock::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"tried to bind to non-GL render buffer");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GLFrameBuffer::addColorBuffer(std::shared_ptr<RenderBuffer> renderBufferIn) {

  // it _better_ be a GL buffer
  std::shared_ptr<GLRenderBuffer> renderBuffer = std::dynamic_pointer_cast<GLRenderBuffer>(renderBufferIn);
  if (!renderBuffer) throw std::runtime_error("tried to bind to non-GL render buffer");

  renderBuffer->bind();
  bind();

  checkGLError();
  renderBuffersColor.push_back(renderBuffer);
  nColorBuffers++;
}